

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetRGBA(GPU_Image *image,Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  SDL_Color local_18;
  SDL_Color c;
  Uint8 a_local;
  Uint8 b_local;
  Uint8 g_local;
  Uint8 r_local;
  GPU_Image *image_local;
  
  local_18.g = g;
  local_18.r = r;
  local_18.b = b;
  local_18.a = a;
  if (image != (GPU_Image *)0x0) {
    image->color = local_18;
  }
  return;
}

Assistant:

void GPU_SetRGBA(GPU_Image* image, Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = a;

    if(image == NULL)
        return;

    image->color = c;
}